

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  AssertionResult local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar4 = "";
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x20fd44);
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_48,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \"\", 0)",
             (char (*) [1])0x20fd44,&local_38);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  bVar2 = local_48.success_;
  if (local_48.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (local_48.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x1a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar2 != false) {
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x24ad41);
    testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
              ((internal *)&local_48,"\"3a\"","HexEncoder::EncodeAsHex((unsigned char *) \":\", 1)",
               (char (*) [3])"3a",&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar2 = local_48.success_;
    if (local_48.success_ == false) {
      testing::Message::Message((Message *)&local_38);
      if (local_48.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x1b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar2 != false) {
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x2201da);
      testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                ((internal *)&local_48,"\"60\"",
                 "HexEncoder::EncodeAsHex((unsigned char *) \"`\", 1)",(char (*) [3])"60",&local_38)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != paVar1) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      bVar2 = local_48.success_;
      if (local_48.success_ == false) {
        testing::Message::Message((Message *)&local_38);
        if (local_48.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x1c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (bVar2 != false) {
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x22019e);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  ((internal *)&local_48,"\"61\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \"a\", 1)",(char (*) [3])"61",
                   &local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        bVar2 = local_48.success_;
        if (local_48.success_ == false) {
          testing::Message::Message((Message *)&local_38);
          if (local_48.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x1d,pcVar4);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (bVar2 != false) {
          bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x229966);
          testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                    ((internal *)&local_48,"\"5d\"",
                     "HexEncoder::EncodeAsHex((unsigned char *) \"]\", 1)",(char (*) [3])"5d",
                     &local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != paVar1) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          bVar2 = local_48.success_;
          if (local_48.success_ == false) {
            testing::Message::Message((Message *)&local_38);
            if (local_48.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x1e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
                (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_48.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (bVar2 != false) {
            bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_38,0x2202d9)
            ;
            testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                      ((internal *)&local_48,"\"7b\"",
                       "HexEncoder::EncodeAsHex((unsigned char *) \"{\", 1)",(char (*) [3])0x2202d2,
                       &local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_38._M_dataplus._M_p != paVar1) {
              operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
            }
            bVar2 = local_48.success_;
            if (local_48.success_ == false) {
              testing::Message::Message((Message *)&local_38);
              if (local_48.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                         ,0x1f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              testing::Message::~Message((Message *)&local_38);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_48.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (bVar2 != false) {
              bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                        ((uchar *)&local_38,0x2202d5);
              testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
                        ((internal *)&local_48,"\"3a60615d7b\"",
                         "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 5)",
                         (char (*) [11])"3a60615d7b",&local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_38._M_dataplus._M_p != paVar1) {
                operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_48.success_ == false) {
                testing::Message::Message((Message *)&local_38);
                if (local_48.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                           ,0x20,pcVar4);
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                testing::Message::~Message((Message *)&local_38);
              }
              testing::AssertionResult::~AssertionResult(&local_48);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) "", 0));
    ASSERT_EQ("3a", HexEncoder::EncodeAsHex((unsigned char *) ":", 1));
    ASSERT_EQ("60", HexEncoder::EncodeAsHex((unsigned char *) "`", 1));
    ASSERT_EQ("61", HexEncoder::EncodeAsHex((unsigned char *) "a", 1));
    ASSERT_EQ("5d", HexEncoder::EncodeAsHex((unsigned char *) "]", 1));
    ASSERT_EQ("7b", HexEncoder::EncodeAsHex((unsigned char *) "{", 1));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 5));
}